

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::OP_ProfiledCallAsmInternal
          (InterpreterStackFrame *this,RegSlot funcReg,RegSlot returnReg,ProfileId profileId)

{
  void *target_00;
  ScriptFunction *function_00;
  FunctionBody *calleeBody;
  FunctionBody *pFVar1;
  DynamicProfileInfo *this_00;
  DynamicProfileInfo *dynamicProfileInfo;
  FunctionBody *body;
  ScriptFunction *function;
  Var target;
  ProfileId profileId_local;
  RegSlot returnReg_local;
  RegSlot funcReg_local;
  InterpreterStackFrame *this_local;
  
  target_00 = GetRegRawPtr<unsigned_int>(this,funcReg);
  function_00 = (ScriptFunction *)OP_CallGetFunc(this,target_00);
  calleeBody = JavascriptFunction::GetFunctionBody((JavascriptFunction *)function_00);
  pFVar1 = GetFunctionBody(this);
  this_00 = FunctionBody::GetDynamicProfileInfo(pFVar1);
  pFVar1 = GetFunctionBody(this);
  DynamicProfileInfo::RecordAsmJsCallSiteInfo(this_00,pFVar1,profileId,calleeBody);
  OP_CallAsmInternalCommon(this,function_00,returnReg);
  return;
}

Assistant:

void InterpreterStackFrame::OP_ProfiledCallAsmInternal(RegSlot funcReg, RegSlot returnReg, ProfileId profileId)
    {
        Var target = GetRegRawPtr(funcReg);
        ScriptFunction* function = (ScriptFunction*)OP_CallGetFunc(target);

        Js::FunctionBody * body = function->GetFunctionBody();
        DynamicProfileInfo * dynamicProfileInfo = GetFunctionBody()->GetDynamicProfileInfo();
        dynamicProfileInfo->RecordAsmJsCallSiteInfo(GetFunctionBody(), profileId, body);
        return OP_CallAsmInternalCommon(function, returnReg);
    }